

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  void *pvVar2;
  CollSeq *pColl;
  Mem *pMem2;
  uint uVar3;
  sqlite3_value *pValue;
  int iVar4;
  ulong uVar5;
  
  pvVar2 = context->pFunc->pUserData;
  pValue = *argv;
  uVar3._0_2_ = pValue->flags;
  uVar3._2_1_ = pValue->enc;
  uVar3._3_1_ = pValue->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
    return;
  }
  if (1 < argc) {
    pColl = context->pVdbe->aOp[(long)context->iOp + -1].p4.pColl;
    iVar4 = 0;
    uVar5 = 1;
    do {
      pMem2 = argv[uVar5];
      uVar1._0_2_ = pMem2->flags;
      uVar1._2_1_ = pMem2->enc;
      uVar1._3_1_ = pMem2->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return;
      }
      uVar3 = sqlite3MemCompare(argv[iVar4],pMem2,pColl);
      if (-1 < (int)(uVar3 ^ -(uint)(pvVar2 != (void *)0x0))) {
        iVar4 = (int)uVar5;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
    pValue = argv[iVar4];
  }
  sqlite3_result_value(context,pValue);
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}